

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_error.hpp
# Opt level: O3

void __thiscall boost::system::system_error::~system_error(system_error *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__system_error_001c9428;
  pcVar2 = (this->m_what)._M_dataplus._M_p;
  paVar1 = &(this->m_what).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

virtual ~system_error() BOOST_NOEXCEPT_OR_NOTHROW {}